

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

bool __thiscall Reducer::tryToReplaceChild(Reducer *this,Expression **child,Expression *with)

{
  Expression *pEVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_48;
  
  bVar2 = isOkReplacement(this,with);
  if ((bVar2) && (pEVar1 = *child, (pEVar1->type).id == (with->type).id)) {
    uVar3 = this->decisionCounter + 1;
    this->decisionCounter = uVar3;
    if (1 < uVar3 % (ulong)(long)this->factor) {
      return false;
    }
    *child = with;
    bVar2 = writeAndTestReduction(this);
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"|      tryToReplaceChild succeeded (in ");
      getLocation_abi_cxx11_(&local_48,this);
      poVar4 = std::operator<<(poVar4,(string *)&local_48);
      std::operator<<(poVar4,")\n");
      std::__cxx11::string::~string((string *)&local_48);
      noteReduction(this,1);
      return true;
    }
    *child = pEVar1;
  }
  return false;
}

Assistant:

bool tryToReplaceChild(Expression*& child, Expression* with) {
    if (!isOkReplacement(with)) {
      return false;
    }
    if (child->type != with->type) {
      return false;
    }
    if (!shouldTryToReduce()) {
      return false;
    }
    auto* before = child;
    child = with;
    if (!writeAndTestReduction()) {
      child = before;
      return false;
    }
    std::cerr << "|      tryToReplaceChild succeeded (in " << getLocation()
              << ")\n";
    // std::cerr << "|      " << before << " => " << with << '\n';
    noteReduction();
    return true;
  }